

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall StringLiteralNode::~StringLiteralNode(StringLiteralNode *this)

{
  StringLiteralNode *in_RDI;
  
  ~StringLiteralNode(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

StringLiteralNode(const std::string& value): value_(value) {}